

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

void __thiscall kratos::Expr::Expr(Expr *this,ExprOp op,Var *left,Var *right)

{
  uint *puVar1;
  Expr *expr;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint32_t uVar6;
  int iVar7;
  undefined4 extraout_var;
  VarException *pVVar8;
  Var *var;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar9;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  Var *local_110;
  Var *local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  Var *local_e0;
  Var *pVStack_d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c0;
  string local_a8;
  undefined8 local_88;
  undefined8 uStack_80;
  ulong local_78;
  string local_60;
  Expr *local_40;
  allocator_type local_31;
  
  local_40 = this;
  iVar3 = (*(left->super_IRNode)._vptr_IRNode[0xd])(left);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
  uVar6 = left->var_width_;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_c0,&left->size_);
  aVar9._1_7_ = 0;
  aVar9._0_1_ = left->is_signed_;
  Var::Var(&local_40->super_Var,(Generator *)CONCAT44(extraout_var,iVar3),&local_a8,uVar6,&local_c0,
           left->is_signed_,Expression);
  if (local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  expr = local_40;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  (expr->super_Var).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002a5658;
  expr->op = op;
  expr->left = left;
  expr->right = right;
  if ((left->super_IRNode).ast_node_type_ != VarKind) {
    __assert_fail("left->ir_node_kind() == IRNodeKind::VarKind",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/expr.cc",
                  0x2ec,"kratos::Expr::Expr(ExprOp, Var *, Var *)");
  }
  if (op - LogicalShiftRight < 3 && right != (Var *)0x0) {
    uVar4 = (*(left->super_IRNode)._vptr_IRNode[7])(left);
    uVar5 = (*(right->super_IRNode)._vptr_IRNode[7])(right);
    if (uVar5 < uVar4) {
      uVar6 = (*(left->super_IRNode)._vptr_IRNode[7])(left);
      resize_var(expr,uVar6,right,false);
      goto LAB_00182140;
    }
  }
  else if (right == (Var *)0x0) goto LAB_00182140;
  iVar3 = (*(left->super_IRNode)._vptr_IRNode[7])(left);
  iVar7 = (*(right->super_IRNode)._vptr_IRNode[7])(right);
  if (iVar3 == iVar7) goto LAB_00182140;
  uVar6 = (*(right->super_IRNode)._vptr_IRNode[7])(right);
  bVar2 = IterVar::safe_to_resize(left,uVar6,right->is_signed_);
  if ((bVar2) && ((Iter < right->type_ || ((0xa8U >> (right->type_ & 0x1f) & 1) == 0)))) {
    uVar6 = (*(right->super_IRNode)._vptr_IRNode[7])(right);
    bVar2 = true;
    var = left;
LAB_0018210d:
    resize_var(expr,uVar6,var,bVar2);
  }
  else {
    uVar6 = (*(left->super_IRNode)._vptr_IRNode[7])(left);
    bVar2 = IterVar::safe_to_resize(right,uVar6,left->is_signed_);
    if (bVar2) {
      uVar6 = (*(left->super_IRNode)._vptr_IRNode[7])(left);
      bVar2 = false;
      var = right;
      goto LAB_0018210d;
    }
  }
  iVar3 = (*(expr->left->super_IRNode)._vptr_IRNode[7])();
  iVar7 = (*(expr->right->super_IRNode)._vptr_IRNode[7])();
  if (iVar3 != iVar7) {
    pVVar8 = (VarException *)__cxa_allocate_exception(0x10);
    (*(left->super_IRNode)._vptr_IRNode[0x1f])(&local_e0,left);
    uVar4 = (*(left->super_IRNode)._vptr_IRNode[7])(left);
    (*(right->super_IRNode)._vptr_IRNode[0x1f])(&local_100,right);
    uVar5 = (*(right->super_IRNode)._vptr_IRNode[7])(right);
    local_a8.field_2._M_allocated_capacity = (size_type)uVar4;
    local_78 = (ulong)uVar5;
    local_a8._M_dataplus._M_p = (pointer)local_e0;
    local_a8._M_string_length = (size_type)pVStack_d8;
    local_88 = local_100;
    uStack_80 = uStack_f8;
    format_str_00.size_ = 0x2d2d;
    format_str_00.data_ = (char *)0x41;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = aVar9.args_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_a8;
    fmt::v7::detail::vformat_abi_cxx11_
              (&local_60,
               (detail *)"left ({0}) width ({1}) doesn\'t match with right ({2}) width ({3})",
               format_str_00,args_00);
    __l_00._M_len = 2;
    __l_00._M_array = (iterator)&local_110;
    local_110 = left;
    local_108 = right;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)&local_a8,
               __l_00,&local_31);
    VarException::VarException
              (pVVar8,&local_60,
               (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)&local_a8)
    ;
    __cxa_throw(pVVar8,&VarException::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_00182140:
  bVar2 = is_relational_op(op);
  uVar6 = 1;
  if (!bVar2) {
    bVar2 = is_reduction_op(op);
    if (!bVar2) {
      uVar6 = left->var_width_;
    }
  }
  (expr->super_Var).var_width_ = uVar6;
  bVar2 = left->is_signed_;
  if (right != (Var *)0x0) {
    if (bVar2 == false) {
      bVar2 = false;
    }
    else {
      bVar2 = right->is_signed_;
    }
  }
  (expr->super_Var).is_signed_ = bVar2;
  (expr->super_Var).type_ = Expression;
  set_parent(expr);
  if (right != (Var *)0x0) {
    iVar3 = (*(left->super_IRNode)._vptr_IRNode[0x18])(left);
    iVar7 = (*(right->super_IRNode)._vptr_IRNode[0x18])(right);
    if ((char)iVar3 != (char)iVar7) {
      puVar1 = (left->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_start;
      if ((4 < (ulong)((long)(left->size_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)puVar1)) || (1 < *puVar1)) {
        pVVar8 = (VarException *)__cxa_allocate_exception(0x10);
        uVar4 = (*(left->super_IRNode)._vptr_IRNode[0x18])(left);
        uVar5 = (*(right->super_IRNode)._vptr_IRNode[0x18])(right);
        local_a8._M_dataplus._M_p = (pointer)(ulong)(uVar4 & 0xff);
        local_a8.field_2._M_allocated_capacity = (size_type)(uVar5 & 0xff);
        format_str.size_ = 0x77;
        format_str.data_ = (char *)0x27;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = aVar9.args_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)&local_a8;
        fmt::v7::detail::vformat_abi_cxx11_
                  (&local_60,(detail *)"left is packed ({0}) but right is ({1})",format_str,args);
        __l._M_len = 2;
        __l._M_array = (iterator)&local_e0;
        local_e0 = left;
        pVStack_d8 = right;
        std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                  ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                   &local_a8,__l,(allocator_type *)&local_100);
        VarException::VarException
                  (pVVar8,&local_60,
                   (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                   &local_a8);
        __cxa_throw(pVVar8,&VarException::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  iVar3 = (*(left->super_IRNode)._vptr_IRNode[0x18])(left);
  (expr->super_Var).is_packed_ = SUB41(iVar3,0);
  return;
}

Assistant:

Expr::Expr(ExprOp op, Var *left, Var *right)
    : Var(left->generator(), "", left->var_width(), left->size(), left->is_signed(),
          VarType::Expression),
      op(op),
      left(left),
      right(right) {
    assert(left->ir_node_kind() == IRNodeKind::VarKind);
    // notice that we allow shifting to have different size
    if (right &&
        (op == ExprOp::ShiftLeft || op == ExprOp::SignedShiftRight ||
         op == ExprOp::LogicalShiftRight) &&
        (left->width() > right->width())) {
        // resize right
        resize_var(this, left->width(), right, false);
    } else if (right != nullptr && left->width() != right->width()) {
        // see if we can resize
        if (IterVar::safe_to_resize(left, right->width(), right->is_signed()) &&
            (right->type() != VarType::ConstValue && right->type() != VarType::Parameter &&
             right->type() != VarType::Iter)) {
            resize_var(this, right->width(), left, true);
        } else if (IterVar::safe_to_resize(right, left->width(), left->is_signed())) {
            resize_var(this, left->width(), right, false);
        }
        if (this->left->width() != this->right->width())
            throw VarException(
                ::format("left ({0}) width ({1}) doesn't match with right ({2}) width ({3})",
                         left->to_string(), left->width(), right->to_string(), right->width()),
                {left, right});
    }

    // if it's a predicate/relational op, the width is one
    if (is_relational_op(op) || is_reduction_op(op))
        var_width_ = 1;
    else
        var_width_ = left->var_width();

    if (right != nullptr)
        is_signed_ = left->is_signed() && right->is_signed();
    else
        is_signed_ = left->is_signed();
    type_ = VarType::Expression;
    set_parent();

    // both of them has to be packed array
    auto const &left_size = left->size();
    if (right != nullptr && left->is_packed() != right->is_packed() &&
        (left_size.size() > 1 || left_size.front() > 1))
        throw VarException(::format("left is packed ({0}) but right is ({1})", left->is_packed(),
                                    right->is_packed()),
                           {left, right});
    is_packed_ = left->is_packed();
}